

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# access.cc
# Opt level: O0

process_id_t __thiscall
tchecker::variable_access_map_t::accessing_process
          (variable_access_map_t *this,variable_id_t vid,variable_type_t vtype,
          variable_access_t vaccess)

{
  vec_iterator<unsigned_int_*,_true> *pvVar1;
  invalid_argument *piVar2;
  reference puVar3;
  vec_iterator<unsigned_int_*,_true> local_48;
  vec_iterator<unsigned_int_*,_true> local_40;
  difference_type local_38;
  difference_type d;
  range_t<boost::container::vec_iterator<unsigned_int_*,_true>,_boost::container::vec_iterator<unsigned_int_*,_true>_>
  range;
  variable_access_t vaccess_local;
  variable_type_t vtype_local;
  variable_id_t vid_local;
  variable_access_map_t *this_local;
  
  range._end.m_ptr._4_4_ = vaccess;
  accessing_processes((variable_access_map_t *)&d,(variable_id_t)this,vid,vtype);
  pvVar1 = range_t<boost::container::vec_iterator<unsigned_int_*,_true>,_boost::container::vec_iterator<unsigned_int_*,_true>_>
           ::begin((range_t<boost::container::vec_iterator<unsigned_int_*,_true>,_boost::container::vec_iterator<unsigned_int_*,_true>_>
                    *)&d);
  boost::container::vec_iterator<unsigned_int_*,_true>::vec_iterator(&local_40,pvVar1);
  pvVar1 = range_t<boost::container::vec_iterator<unsigned_int_*,_true>,_boost::container::vec_iterator<unsigned_int_*,_true>_>
           ::end((range_t<boost::container::vec_iterator<unsigned_int_*,_true>,_boost::container::vec_iterator<unsigned_int_*,_true>_>
                  *)&d);
  boost::container::vec_iterator<unsigned_int_*,_true>::vec_iterator(&local_48,pvVar1);
  local_38 = std::distance<boost::container::vec_iterator<unsigned_int*,true>>(&local_40,&local_48);
  if (local_38 == 0) {
    piVar2 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar2,"Unknown variable");
    __cxa_throw(piVar2,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  if (1 < local_38) {
    piVar2 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar2,"Shared variable");
    __cxa_throw(piVar2,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  pvVar1 = range_t<boost::container::vec_iterator<unsigned_int_*,_true>,_boost::container::vec_iterator<unsigned_int_*,_true>_>
           ::begin((range_t<boost::container::vec_iterator<unsigned_int_*,_true>,_boost::container::vec_iterator<unsigned_int_*,_true>_>
                    *)&d);
  puVar3 = boost::container::vec_iterator<unsigned_int_*,_true>::operator*(pvVar1);
  return *puVar3;
}

Assistant:

process_id_t variable_access_map_t::accessing_process(tchecker::variable_id_t vid, enum tchecker::variable_type_t vtype,
                                                      enum tchecker::variable_access_t vaccess) const
{
  auto range = accessing_processes(vid, vtype, vaccess);
  auto d = std::distance(range.begin(), range.end());
  if (d == 0)
    throw std::invalid_argument("Unknown variable");
  if (d > 1)
    throw std::invalid_argument("Shared variable");
  return *range.begin();
}